

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_executor.cpp
# Opt level: O0

void __thiscall
duckdb::WindowExecutorBoundsState::WindowExecutorBoundsState
          (WindowExecutorBoundsState *this,WindowExecutorGlobalState *gstate)

{
  long in_RSI;
  undefined8 *in_RDI;
  vector<duckdb::LogicalType,_true> bounds_types;
  WindowExecutorGlobalState *in_stack_ffffffffffffff78;
  DataChunk *in_stack_ffffffffffffff80;
  undefined1 *puVar1;
  vector<duckdb::LogicalType,_true> *this_00;
  LogicalType *this_01;
  undefined1 local_51;
  idx_t in_stack_ffffffffffffffb0;
  BoundWindowExpression *in_stack_ffffffffffffffb8;
  WindowBoundariesState *in_stack_ffffffffffffffc0;
  idx_t in_stack_ffffffffffffffc8;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffd0;
  Allocator *in_stack_ffffffffffffffd8;
  DataChunk *in_stack_ffffffffffffffe0;
  
  WindowExecutorLocalState::WindowExecutorLocalState
            ((WindowExecutorLocalState *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *in_RDI = &PTR__WindowExecutorBoundsState_03534e10;
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x18);
  in_RDI[3] = *(undefined8 *)(in_RSI + 0x20);
  this_01 = (LogicalType *)(in_RDI + 4);
  DataChunk::DataChunk(in_stack_ffffffffffffff80);
  this_00 = (vector<duckdb::LogicalType,_true> *)(in_RDI + 0xc);
  WindowBoundariesState::WindowBoundariesState
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  LogicalType::LogicalType(this_01,(LogicalTypeId)((ulong)in_RDI >> 0x38));
  puVar1 = &local_51;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x1a3c87e);
  vector<duckdb::LogicalType,_true>::vector
            (this_00,(size_type)puVar1,(value_type *)in_stack_ffffffffffffff80,
             (allocator_type *)in_stack_ffffffffffffff78);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1a3c8a3);
  LogicalType::~LogicalType((LogicalType *)0x1a3c8ad);
  Allocator::Get((ClientContext *)0x1a3c8cc);
  DataChunk::Initialize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1a3c8f7);
  return;
}

Assistant:

WindowExecutorBoundsState::WindowExecutorBoundsState(const WindowExecutorGlobalState &gstate)
    : WindowExecutorLocalState(gstate), partition_mask(gstate.partition_mask), order_mask(gstate.order_mask),
      state(gstate.executor.wexpr, gstate.payload_count) {
	vector<LogicalType> bounds_types(8, LogicalType(LogicalTypeId::UBIGINT));
	bounds.Initialize(Allocator::Get(gstate.executor.context), bounds_types);
}